

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationRuleParser::parseUnicodeSet
          (CollationRuleParser *this,int32_t i,UnicodeSet *set,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  int iVar3;
  char *pcVar4;
  char16_t *pcVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint i_00;
  UnicodeString local_70;
  
  pUVar2 = this->rules;
  sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar6 = (pUVar2->fUnion).fFields.fLength;
  }
  else {
    uVar6 = (int)sVar1 >> 5;
  }
  i_00 = i;
  if (uVar6 != i) {
    lVar7 = 0;
    iVar8 = 0;
    do {
      iVar3 = (int)lVar7;
      if ((uint)(i + iVar3) < uVar6) {
        pcVar5 = (char16_t *)((long)&pUVar2->fUnion + 2);
        if (((int)sVar1 & 2U) == 0) {
          pcVar5 = (pUVar2->fUnion).fFields.fArray;
        }
        if (pcVar5[i + lVar7] == L']') {
          iVar8 = iVar8 + -1;
          if (iVar8 == 0) {
            icu_63::UnicodeString::tempSubString(&local_70,pUVar2,i,iVar3 + 1);
            UnicodeSet::applyPattern(set,&local_70,errorCode);
            i_00 = iVar3 + 1 + i;
            icu_63::UnicodeString::~UnicodeString(&local_70);
            if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              i_00 = skipWhiteSpace(this,i_00);
              pUVar2 = this->rules;
              sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                uVar6 = (pUVar2->fUnion).fFields.fLength;
              }
              else {
                uVar6 = (int)sVar1 >> 5;
              }
              if (i_00 < uVar6) {
                if (((int)sVar1 & 2U) == 0) {
                  pcVar5 = (pUVar2->fUnion).fFields.fArray;
                }
                else {
                  pcVar5 = (char16_t *)((long)&pUVar2->fUnion + 2);
                }
                if (pcVar5[(int)i_00] == L']') {
                  return i_00 + 1;
                }
              }
              if (U_ZERO_ERROR < *errorCode) {
                return i_00;
              }
              *errorCode = U_INVALID_FORMAT_ERROR;
              pcVar4 = "missing option-terminating \']\' after UnicodeSet pattern";
            }
            else {
              *errorCode = U_INVALID_FORMAT_ERROR;
              pcVar4 = "not a valid UnicodeSet pattern";
            }
            goto LAB_0022ebe0;
          }
        }
        else if (pcVar5[i + lVar7] == L'[') {
          iVar8 = iVar8 + 1;
        }
      }
      lVar7 = lVar7 + 1;
      i_00 = uVar6;
    } while ((i - uVar6) + (int)lVar7 != 0);
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    *errorCode = U_INVALID_FORMAT_ERROR;
    pcVar4 = "unbalanced UnicodeSet pattern brackets";
LAB_0022ebe0:
    this->errorReason = pcVar4;
    if (this->parseError != (UParseError *)0x0) {
      setErrorContext(this);
    }
  }
  return i_00;
}

Assistant:

int32_t
CollationRuleParser::parseUnicodeSet(int32_t i, UnicodeSet &set, UErrorCode &errorCode) {
    // Collect a UnicodeSet pattern between a balanced pair of [brackets].
    int32_t level = 0;
    int32_t j = i;
    for(;;) {
        if(j == rules->length()) {
            setParseError("unbalanced UnicodeSet pattern brackets", errorCode);
            return j;
        }
        UChar c = rules->charAt(j++);
        if(c == 0x5b) {  // '['
            ++level;
        } else if(c == 0x5d) {  // ']'
            if(--level == 0) { break; }
        }
    }
    set.applyPattern(rules->tempSubStringBetween(i, j), errorCode);
    if(U_FAILURE(errorCode)) {
        errorCode = U_ZERO_ERROR;
        setParseError("not a valid UnicodeSet pattern", errorCode);
        return j;
    }
    j = skipWhiteSpace(j);
    if(j == rules->length() || rules->charAt(j) != 0x5d) {
        setParseError("missing option-terminating ']' after UnicodeSet pattern", errorCode);
        return j;
    }
    return ++j;
}